

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void testBase64(void)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  size_t size_00;
  StringRef *string;
  char *pcVar6;
  Array<char,_axl::sl::ArrayDetails<char>_> dec_1;
  String enc_1;
  size_t j;
  Rwi rwi;
  size_t size;
  int i;
  Array<char,_axl::sl::ArrayDetails<char>_> source;
  String enc;
  Array<char,_axl::sl::ArrayDetails<char>_> dec;
  char s [65];
  undefined7 in_stack_fffffffffffffe98;
  ValueArg in_stack_fffffffffffffe9f;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_fffffffffffffeb0;
  StringRef *in_stack_fffffffffffffeb8;
  uint_t flags;
  size_t local_e8;
  Rwi local_e0;
  ulong local_d8;
  int local_cc;
  Array local_c8 [104];
  ArrayRef<char,_axl::sl::ArrayDetails<char>_> local_60;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  char local_18 [24];
  
  builtin_strncpy(local_18,"IGkgaHVpISEhIQ==",0x11);
  local_28 = 0x736b575a32466d63;
  uStack_20 = 0x76356d6476644749;
  local_38 = 0x32466d6331314749;
  uStack_30 = 0x31314749376b575a;
  local_48 = 0x6e42434c70564861;
  uStack_40 = 0x70427962755a3362;
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
            (in_stack_fffffffffffffeb0,
             (C *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  axl::enc::Base64Encoding::decode(in_stack_fffffffffffffeb8);
  flags = (uint_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::~StringRefBase
            ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1134e6);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::append
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe9f,0x1134fa);
  pcVar5 = axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::cp(&local_60);
  printf("decoded: %s\n",pcVar5);
  pcVar5 = axl::sl::Array::operator_cast_to_char_((Array *)&local_60);
  size_00 = axl::sl::ArrayRef<char,_axl::sl::ArrayDetails<char>_>::getCount(&local_60);
  axl::enc::Base64Encoding::encode(pcVar5,size_00,flags);
  string = (StringRef *)
           axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::sz
                     (in_stack_fffffffffffffea0);
  printf("encoded: %s\n",string);
  printf("orginal: %s\n",&local_48);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1135b9);
  for (local_cc = 0; local_cc < 500; local_cc = local_cc + 1) {
    uVar2 = rand();
    uVar3 = uVar2;
    if ((int)uVar2 < 0) {
      uVar3 = uVar2 + 0x3f;
    }
    local_d8 = (ulong)(int)((uVar2 + 0x10) - (uVar3 & 0xffffffc0));
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::setCount
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)in_stack_fffffffffffffea0,
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Rwi::Rwi
              ((Rwi *)in_stack_fffffffffffffea0,
               (Array<char,_axl::sl::ArrayDetails<char>_> *)
               CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    for (local_e8 = 0; local_e8 < local_d8; local_e8 = local_e8 + 1) {
      iVar4 = rand();
      cVar1 = (char)iVar4;
      pcVar6 = axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::Rwi::operator[]
                         (&local_e0,local_e8);
      *pcVar6 = cVar1;
    }
    in_stack_fffffffffffffea0 =
         (StringBase<char,_axl::sl::StringDetailsBase<char>_> *)
         axl::sl::Array::operator_cast_to_char_(local_c8);
    axl::enc::Base64Encoding::encode(pcVar5,size_00,(uint_t)((ulong)string >> 0x20));
    axl::enc::Base64Encoding::decode(string);
    axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
              ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x113752);
    axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x11375c);
  }
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x11379f);
  axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x1137ac);
  axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::~Array
            ((Array<char,_axl::sl::ArrayDetails<char>_> *)0x1137b9);
  return;
}

Assistant:

void
testBase64() {
	char s[] = "aHVpLCBnb3ZubyBpIG11cmF2ZWk7IG11cmF2ZWksIGdvdm5vIGkgaHVpISEhIQ==";

	sl::Array<char> dec = enc::Base64Encoding::decode(s);
	dec.append(0);
	printf("decoded: %s\n", dec.cp());

	sl::String enc = enc::Base64Encoding::encode(dec, dec.getCount() - 1);
	printf("encoded: %s\n", enc.sz());
	printf("orginal: %s\n", s);
	ASSERT(enc == s);

	sl::Array<char> source;

	for (int i = 0; i < 500; i++) {
		size_t size = rand() % 64 + 16;
		source.setCount(size);
		sl::Array<char>::Rwi rwi = source;

		for (size_t j = 0; j < size; j++)
			rwi[j] = (char)rand();

		sl::String enc = enc::Base64Encoding::encode(source, size);
		sl::Array<char> dec = enc::Base64Encoding::decode(enc);
		ASSERT(dec.getCount() == size && memcmp(dec, source, size) == 0);
	}
}